

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O1

void printIssues(LoggerPtr *l,bool headings,bool cellmlElementTypes,bool rule)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  ostream *poVar4;
  ulong uVar5;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  char *pcVar6;
  ulong uVar7;
  bool bVar8;
  double dVar9;
  undefined1 auVar10 [16];
  long *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  long local_68 [2];
  undefined1 local_58 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  double local_48;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  local_3c = (undefined4)CONCAT71(in_register_00000009,rule);
  local_38 = (undefined4)CONCAT71(in_register_00000011,cellmlElementTypes);
  local_34 = (undefined4)CONCAT71(in_register_00000031,headings);
  uVar2 = libcellml::Logger::errorCount();
  auVar10._8_4_ = (int)((ulong)uVar2 >> 0x20);
  auVar10._0_8_ = uVar2;
  auVar10._12_4_ = 0x45300000;
  local_48 = log10((auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0));
  lVar3 = libcellml::Logger::issueCount();
  if (lVar3 != 0) {
    dVar9 = floor(local_48);
    local_48 = (double)(long)(int)dVar9;
    uVar7 = 1;
    do {
      libcellml::Logger::issue((ulong)&local_78);
      iVar1 = libcellml::Issue::level();
      if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
      }
      if (iVar1 == 0) {
        lVar3 = 6;
        pcVar6 = "Error ";
LAB_0010501b:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar6,lVar3);
        *(double *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
             local_48;
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
      }
      else {
        if (iVar1 == 1) {
          lVar3 = 8;
          pcVar6 = "Warning ";
          goto LAB_0010501b;
        }
        if (iVar1 == 2) {
          lVar3 = 8;
          pcVar6 = "Message ";
          goto LAB_0010501b;
        }
      }
      if ((char)local_34 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
        libcellml::Logger::issue((ulong)local_58);
        libcellml::Issue::referenceHeading_abi_cxx11_();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)local_78,(long)local_70);
        if (local_78 != local_68) {
          operator_delete(local_78,local_68[0] + 1);
        }
        if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
        }
      }
      if ((char)local_38 != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
        libcellml::Logger::issue((ulong)local_58);
        libcellml::Issue::item();
        iVar1 = libcellml::AnyCellmlElement::type();
        std::ostream::operator<<(&std::cout,iVar1);
        if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
        }
        if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
        }
      }
      if ((char)local_3c != '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
        libcellml::Logger::issue((ulong)&local_78);
        iVar1 = libcellml::Issue::referenceRule();
        std::ostream::operator<<(&std::cout,iVar1);
        if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
        }
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
      std::ostream::put('8');
      poVar4 = (ostream *)std::ostream::flush();
      libcellml::Logger::issue((ulong)local_58);
      libcellml::Issue::description_abi_cxx11_();
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,(char *)local_78,(long)local_70);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      if (local_78 != local_68) {
        operator_delete(local_78,local_68[0] + 1);
      }
      if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
      }
      uVar5 = libcellml::Logger::issueCount();
      bVar8 = uVar7 < uVar5;
      uVar7 = uVar7 + 1;
    } while (bVar8);
  }
  return;
}

Assistant:

void printIssues(const libcellml::LoggerPtr &l, bool headings, bool cellmlElementTypes, bool rule)
{
    int width = int(floor(log10(l->errorCount())));
    for (size_t i = 0; i < l->issueCount(); ++i) {
        switch (l->issue(i)->level()) {
        case libcellml::Issue::Level::ERROR:
            std::cout << "Error " << std::setw(width) << i + 1 << ": ";
            break;
        case libcellml::Issue::Level::WARNING:
            std::cout << "Warning " << std::setw(width) << i + 1 << ": ";
            break;
        case libcellml::Issue::Level::MESSAGE:
            std::cout << "Message " << std::setw(width) << i + 1 << ": ";
            break;
        default:
            break;
        }

        if (headings) {
            std::cout << ", " << l->issue(i)->referenceHeading();
        }
        if (cellmlElementTypes) {
            std::cout << ", " << static_cast<int>(l->issue(i)->item()->type());
        }
        if (rule) {
            std::cout << ", " << static_cast<int>(l->issue(i)->referenceRule());
        }
        std::cout << std::endl
                  << l->issue(i)->description() << std::endl;
    }
}